

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
::RetreatPastEmptyBuckets
          (DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
           *this)

{
  bool bVar1;
  unsigned_long *puVar2;
  bool local_2a;
  bool local_29;
  unsigned_long local_20;
  unsigned_long Tombstone;
  unsigned_long Empty;
  DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
  *this_local;
  
  Empty = (unsigned_long)this;
  if (this->End <= this->Ptr) {
    Tombstone = DenseMapInfo<unsigned_long>::getEmptyKey();
    local_20 = DenseMapInfo<unsigned_long>::getTombstoneKey();
    while( true ) {
      local_29 = false;
      if (this->Ptr != this->End) {
        puVar2 = detail::DenseMapPair<unsigned_long,_unsigned_long>::getFirst(this->Ptr + -1);
        bVar1 = DenseMapInfo<unsigned_long>::isEqual(puVar2,&Tombstone);
        local_2a = true;
        if (!bVar1) {
          puVar2 = detail::DenseMapPair<unsigned_long,_unsigned_long>::getFirst(this->Ptr + -1);
          local_2a = DenseMapInfo<unsigned_long>::isEqual(puVar2,&local_20);
        }
        local_29 = local_2a;
      }
      if (local_29 == false) break;
      this->Ptr = this->Ptr + -1;
    }
    return;
  }
  __assert_fail("Ptr >= End",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                ,0x4ea,
                "void llvm::DenseMapIterator<unsigned long, unsigned long>::RetreatPastEmptyBuckets() [KeyT = unsigned long, ValueT = unsigned long, KeyInfoT = llvm::DenseMapInfo<unsigned long>, Bucket = llvm::detail::DenseMapPair<unsigned long, unsigned long>, IsConst = false]"
               );
}

Assistant:

void RetreatPastEmptyBuckets() {
    assert(Ptr >= End);
    const KeyT Empty = KeyInfoT::getEmptyKey();
    const KeyT Tombstone = KeyInfoT::getTombstoneKey();

    while (Ptr != End && (KeyInfoT::isEqual(Ptr[-1].getFirst(), Empty) ||
                          KeyInfoT::isEqual(Ptr[-1].getFirst(), Tombstone)))
      --Ptr;
  }